

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_DoublingFactorCounterTest_ThirteenOrphans_TestShell::createTest
          (TEST_DoublingFactorCounterTest_ThirteenOrphans_TestShell *this)

{
  TEST_DoublingFactorCounterTest_ThirteenOrphans_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_ThirteenOrphans_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x2ac);
  TEST_DoublingFactorCounterTest_ThirteenOrphans_Test::
  TEST_DoublingFactorCounterTest_ThirteenOrphans_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, ThirteenOrphans)
{
	h.add(Tile::OneOfCharacters);
	h.add(Tile::NineOfCharacters);
	h.add(Tile::OneOfCircles);
	h.add(Tile::NineOfCircles);
	h.add(Tile::OneOfBamboos);
	h.add(Tile::NineOfBamboos);
	h.add(Tile::EastWind);
	h.add(Tile::SouthWind);
	h.add(Tile::WestWind);
	h.add(Tile::NorthWind);
	h.add(Tile::WhiteDragon);
	h.add(Tile::GreenDragon);
	addPair(Tile::RedDragon);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThirteenOrphans));
	CHECK_EQUAL(100, r.doubling_factor);
}